

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputDCTDecodeStream.cpp
# Opt level: O0

void __thiscall InputDCTDecodeStream::InputDCTDecodeStream(InputDCTDecodeStream *this)

{
  InputDCTDecodeStream *this_local;
  
  IByteReader::IByteReader(&this->super_IByteReader);
  (this->super_IByteReader)._vptr_IByteReader = (_func_int **)&PTR__InputDCTDecodeStream_00550060;
  this->mStream = (IByteReader *)0x0;
  this->mIsDecoding = false;
  this->mIsHeaderRead = false;
  this->mCurrentSampleRow = 0;
  this->mTotalSampleRows = 0;
  this->mIndexInRow = 0;
  return;
}

Assistant:

InputDCTDecodeStream::InputDCTDecodeStream(void)
{
    mStream = NULL;
	mIsDecoding = false;
    mIsHeaderRead = false;
    mCurrentSampleRow = 0;
    mTotalSampleRows = 0;
    mIndexInRow = 0;
}